

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

bool __thiscall cursespp::ScrollableWindow::KeyPress(ScrollableWindow *this,string *key)

{
  char cVar1;
  int iVar2;
  INavigationKeys *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  
  pIVar3 = Window::NavigationKeys();
  cVar1 = (**(code **)(*(long *)pIVar3 + 0x40))(pIVar3,key);
  if (cVar1 == '\0') {
    cVar1 = (**(code **)(*(long *)pIVar3 + 0x38))(pIVar3,key);
    if (cVar1 == '\0') {
      cVar1 = (**(code **)(*(long *)pIVar3 + 0x18))(pIVar3,key);
      if (cVar1 == '\0') {
        cVar1 = (**(code **)(*(long *)pIVar3 + 0x10))(pIVar3,key);
        if (cVar1 == '\0') {
          cVar1 = (**(code **)(*(long *)pIVar3 + 0x48))(pIVar3,key);
          if (cVar1 != '\0') {
            (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x39])(this);
            return true;
          }
          cVar1 = (**(code **)(*(long *)pIVar3 + 0x50))(pIVar3,key);
          if (cVar1 != '\0') {
            (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3a])(this);
            return true;
          }
          return false;
        }
        iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x41])(this);
        lVar4 = *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x20);
        (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3b])(this,1);
      }
      else {
        iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x41])(this);
        lVar4 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x20);
        (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3c])(this,1);
      }
      iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x41])(this);
      return (bool)(this->allowArrowKeyPropagation ^ 1U |
                   lVar4 != *(long *)(CONCAT44(extraout_var_01,iVar2) + 0x20));
    }
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3d])(this);
  }
  else {
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3e])(this);
  }
  return true;
}

Assistant:

bool ScrollableWindow::KeyPress(const std::string& key) {
    /* note we allow KEY_DOWN and KEY_UP to continue to propagate if
    the logical (selected) index doesn't actually change -- i.e. the
    user is at the beginning or end of the scrollable area. this is so
    controllers can change focus in response to UP/DOWN if necessary. */
    auto& keys = NavigationKeys();

    if (keys.PageDown(key)) { this->PageDown(); return true; }
    else if (keys.PageUp(key)) { this->PageUp(); return true; }
    else if (keys.Down(key)) {
        const size_t before = this->GetScrollPosition().logicalIndex;
        this->ScrollDown();
        const size_t after = this->GetScrollPosition().logicalIndex;
        return !this->allowArrowKeyPropagation || (before != after);
    }
    else if (keys.Up(key)) {
        const size_t before = this->GetScrollPosition().logicalIndex;
        this->ScrollUp();
        const size_t after = this->GetScrollPosition().logicalIndex;
        return !this->allowArrowKeyPropagation || (before != after);
    }
    else if (keys.Home(key)) { this->ScrollToTop(); return true; }
    else if (keys.End(key)) { this->ScrollToBottom(); return true; }
    return false;
}